

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IIR2xResampler.cpp
# Opt level: O0

void __thiscall
SRCTools::IIR2xInterpolator::process
          (IIR2xInterpolator *this,FloatSample **inSamples,uint *inLength,FloatSample **outSamples,
          uint *outLength)

{
  float fVar1;
  float fVar2;
  FloatSample *pFVar3;
  IIRSection *section_00;
  bool bVar4;
  float fVar5;
  float local_80;
  BufferedSample denOutSample_1;
  BufferedSample numOutSample_1;
  BufferedSample denOutSample;
  BufferedSample numOutSample;
  SectionBuffer *buffer;
  IIRSection *section;
  float local_48;
  uint i;
  BufferedSample tmpOut;
  FloatSample inSample;
  FloatSample lastInputSample;
  uint chIx;
  SectionBuffer *bufferp;
  uint *outLength_local;
  FloatSample **outSamples_local;
  uint *inLength_local;
  FloatSample **inSamples_local;
  IIR2xInterpolator *this_local;
  
  while( true ) {
    bVar4 = false;
    if (*outLength != 0) {
      bVar4 = *inLength != 0;
    }
    if (!bVar4) break;
    _lastInputSample = (this->super_IIRResampler).constants.buffer;
    for (inSample = 0.0; (uint)inSample < 2; inSample = (FloatSample)((int)inSample + 1)) {
      fVar1 = this->lastInputSamples[(uint)inSample];
      fVar2 = (*inSamples)[(uint)inSample];
      if (this->phase == 0) {
        local_80 = 0.0;
      }
      else {
        local_80 = fVar2 * (this->super_IIRResampler).constants.fir;
      }
      local_48 = local_80;
      for (section._4_4_ = 0; section._4_4_ < (this->super_IIRResampler).constants.sectionsCount;
          section._4_4_ = section._4_4_ + 1) {
        section_00 = (this->super_IIRResampler).constants.sections + section._4_4_;
        if (this->phase == 0) {
          fVar5 = calcDenominator(section_00,section_00->num1 * fVar1 + 1e-20,(*_lastInputSample)[0]
                                  ,(*_lastInputSample)[1]);
          (*_lastInputSample)[1] = fVar5;
        }
        else {
          fVar5 = calcDenominator(section_00,section_00->num2 * fVar1 + 1e-20,(*_lastInputSample)[1]
                                  ,(*_lastInputSample)[0]);
          (*_lastInputSample)[0] = fVar5;
        }
        local_48 = fVar5 + local_48;
        _lastInputSample = _lastInputSample + 1;
      }
      pFVar3 = *outSamples;
      *outSamples = pFVar3 + 1;
      *pFVar3 = local_48 * 2.0;
      if (this->phase != 0) {
        this->lastInputSamples[(uint)inSample] = fVar2;
      }
    }
    *outLength = *outLength - 1;
    if (this->phase == 0) {
      this->phase = 1;
    }
    else {
      *inSamples = *inSamples + 2;
      *inLength = *inLength - 1;
      this->phase = 0;
    }
  }
  return;
}

Assistant:

void IIR2xInterpolator::process(const FloatSample *&inSamples, unsigned int &inLength, FloatSample *&outSamples, unsigned int &outLength) {
	static const IIRCoefficient INTERPOLATOR_AMP = 2.0;

	while (outLength > 0 && inLength > 0) {
		SectionBuffer *bufferp = constants.buffer;
		for (unsigned int chIx = 0; chIx < IIR_RESAMPER_CHANNEL_COUNT; ++chIx) {
			const FloatSample lastInputSample = lastInputSamples[chIx];
			const FloatSample inSample = inSamples[chIx];
			BufferedSample tmpOut = phase == 0 ? 0 : inSample * constants.fir;
			for (unsigned int i = 0; i < constants.sectionsCount; ++i) {
				const IIRSection &section = constants.sections[i];
				SectionBuffer &buffer = *bufferp;
				// For 2x interpolation, calculation of the numerator reduces to a single multiplication depending on the phase.
				if (phase == 0) {
					const BufferedSample numOutSample = section.num1 * lastInputSample;
					const BufferedSample denOutSample = calcDenominator(section, BIAS + numOutSample, buffer[0], buffer[1]);
					buffer[1] = denOutSample;
					tmpOut += denOutSample;
				} else {
					const BufferedSample numOutSample = section.num2 * lastInputSample;
					const BufferedSample denOutSample = calcDenominator(section, BIAS + numOutSample, buffer[1], buffer[0]);
					buffer[0] = denOutSample;
					tmpOut += denOutSample;
				}
				bufferp++;
			}
			*(outSamples++) = FloatSample(INTERPOLATOR_AMP * tmpOut);
			if (phase > 0) {
				lastInputSamples[chIx] = inSample;
			}
		}
		outLength--;
		if (phase > 0) {
			inSamples += IIR_RESAMPER_CHANNEL_COUNT;
			inLength--;
			phase = 0;
		} else {
			phase = 1;
		}
	}
}